

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__wrap_t____gles_sampler_wrap
          (ColladaParserAutoGen14Private *this)

{
  ParserChar **text;
  ColladaParserAutoGen14 *pCVar1;
  bool bVar2;
  int iVar3;
  StringHash SVar4;
  long lVar5;
  undefined1 uVar6;
  bool failed;
  bool local_19;
  
  text = &(this->
          super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
          ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
  SVar4 = GeneratedSaxParser::Utils::calculateStringHash
                    (text,(this->
                          super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                          ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack,&local_19);
  lVar5 = 0;
  do {
    if (*(StringHash *)((long)&ENUM__gles_sampler_wrapMap + lVar5) == SVar4) {
      local_19 = false;
      pCVar1 = (this->
               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               ).mImpl;
      iVar3 = (*pCVar1->_vptr_ColladaParserAutoGen14[699])
                        (pCVar1,(ulong)*(uint *)(&UNK_0083a728 + lVar5));
      uVar6 = (undefined1)iVar3;
      goto LAB_0069bd83;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_19 = true;
  bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                    ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                     ERROR_TEXTDATA_PARSING_FAILED,0x7e88664,(ParserChar *)0x0,
                     (this->
                     super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                     ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData);
  uVar6 = !bVar2;
LAB_0069bd83:
  if (*text != (ParserChar *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject
              (&(this->
                super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ).super_ParserTemplateBase.mStackMemoryManager);
  }
  *text = (ParserChar *)0x0;
  (this->
  super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
  ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = (ParserChar *)0x0;
  return (bool)uVar6;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__wrap_t____gles_sampler_wrap()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__wrap_t____gles_sampler_wrap();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
ENUM__gles_sampler_wrap parameter = Utils::toEnum<ENUM__gles_sampler_wrap, StringHash, ENUM__gles_sampler_wrap__COUNT>((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed, ENUM__gles_sampler_wrapMap, Utils::calculateStringHash);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__wrap_t____gles_sampler_wrap(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_WRAP_T, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;

}